

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_text<embree::Vec2<int>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *vec)

{
  Vec2<int> VVar1;
  int __oflag;
  size_t i;
  ulong uVar2;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_70;
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,name,(allocator *)&local_70.field_0);
  open(this,(char *)local_48,__oflag);
  std::__cxx11::string::~string(local_48);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(vec->
                            super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    tab(this);
    VVar1.field_0 =
         (anon_union_8_2_4062524c_for_Vec2<int>_1)
         *(anon_union_8_2_4062524c_for_Vec2<int>_1 *)
          &(vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl
           .super__Vector_impl_data._M_start[uVar2].field_0.field_0;
    local_70._0_4_ = (float)VVar1.field_0._0_4_;
    local_70._4_4_ = (float)VVar1.field_0._4_4_;
    store_array_elt(this,(Vec2f *)&local_70.field_0);
  }
  std::__cxx11::string::string(local_68,name,(allocator *)&local_70.field_0);
  close(this,(int)local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }